

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortL.c
# Opt level: O0

int bursttraverseL(TRIE *node,uchar **strings,int pos,int deep)

{
  uint local_30;
  uint sizeOfContainer;
  uint off;
  uint i;
  LIST *l;
  int deep_local;
  int pos_local;
  uchar **strings_local;
  TRIE *node_local;
  
  l._4_4_ = pos;
  for (sizeOfContainer = 0; sizeOfContainer < 0x100; sizeOfContainer = sizeOfContainer + 1) {
    if (node->counts[sizeOfContainer] < 0) {
      l._4_4_ = bursttraverseL(node->ptrs[sizeOfContainer],strings,l._4_4_,deep + 1);
    }
    else {
      local_30 = l._4_4_;
      for (_off = node->ptrs[sizeOfContainer]; _off != (trierec *)0x0; _off = _off->ptrs[1]) {
        strings[local_30] = (uchar *)_off->ptrs[0];
        local_30 = local_30 + 1;
      }
      if ((sizeOfContainer != 0) && (1 < local_30 - l._4_4_)) {
        if (local_30 - l._4_4_ < 0x14) {
          inssort(strings + (int)l._4_4_,local_30 - l._4_4_,deep + 1);
        }
        else {
          mkqsort(strings + (int)l._4_4_,local_30 - l._4_4_,deep + 1);
        }
      }
      l._4_4_ = local_30;
    }
  }
  free(node);
  return l._4_4_;
}

Assistant:

static int
bursttraverseL(TRIE *node, unsigned char **strings, int pos, int deep)
{
    LIST	*l;
    unsigned int i, off;
    unsigned int sizeOfContainer = 0;

    for( i=0 ; i<ALPHABET ; i++ )
    {
        if( node->counts[i]<0 )
        {
            pos = bursttraverseL(node->ptrs[i], strings, pos, deep+1);
	    }
        else
        {
            for( off=pos, l=(LIST *) node->ptrs[i] ; l!=NULL ; off++, l=l->next )
            {
                strings[off] = l->word;
            }
            sizeOfContainer = (off - pos); 

            if( i>0 && sizeOfContainer > 1 )
            {
                if (sizeOfContainer < INSERTBREAK)
                    inssort( strings+pos, off-pos, deep + 1);     
                else
                    mkqsort( strings+pos, off-pos, deep + 1);
            }
            pos = off;
        }
    }
    free(node);
    return pos;
}